

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsHttpRequest::~TadsHttpRequest(TadsHttpRequest *this)

{
  CVmWeakRef *pCVar1;
  CVmWeakRefable *in_RDI;
  
  (in_RDI->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsHttpRequest_0042bbf0;
  CVmRefCntObj::release_ref(&in_RDI->super_CVmRefCntObj);
  CVmRefCntObj::release_ref(&in_RDI->super_CVmRefCntObj);
  CVmWeakRefable::release_ref(in_RDI);
  CVmRefCntObj::release_ref(&in_RDI->super_CVmRefCntObj);
  pCVar1 = in_RDI[2].weakref;
  if (pCVar1 != (CVmWeakRef *)0x0) {
    TadsHttpRequestHeader::~TadsHttpRequestHeader((TadsHttpRequestHeader *)in_RDI);
    operator_delete(pCVar1,0x18);
  }
  if (in_RDI[3].super_CVmRefCntObj._vptr_CVmRefCntObj != (_func_int **)0x0) {
    CVmRefCntObj::release_ref(&in_RDI->super_CVmRefCntObj);
  }
  TadsEventMessage::~TadsEventMessage((TadsEventMessage *)0x25a63a);
  return;
}

Assistant:

~TadsHttpRequest()
    {
        /* done with our thread and resource name string references */
        resource_name->release_ref();
        verb->release_ref();
        thread->release_ref();
        headers->release_ref();
        delete hdr_list;
        if (body != 0)
            body->release_ref();
    }